

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Char * getContext(XML_Parser parser)

{
  XML_Char XVar1;
  undefined1 uVar2;
  NAMED *pNVar3;
  bool bVar4;
  int iVar5;
  NAMED *pNVar6;
  ENTITY *e;
  XML_Char *s_1;
  PREFIX *prefix;
  XML_Char *s;
  int local_38;
  int len_1;
  int i_1;
  int len;
  int i;
  int needSep;
  HASH_TABLE_ITER iter;
  XML_Parser parser_local;
  
  bVar4 = false;
  iter.end = (NAMED **)parser;
  if (*(long *)((long)parser + 0x398) != 0) {
    if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
       (iVar5 = poolGrow((STRING_POOL *)((long)parser + 0x418)), iVar5 == 0)) {
      return (XML_Char *)0x0;
    }
    pNVar6 = iter.end[0x86];
    iter.end[0x86] = (NAMED *)((long)&pNVar6->name + 1);
    *(undefined1 *)&pNVar6->name = 0x3d;
    len_1 = *(int *)&iter.end[0x73][5].name;
    if (*(char *)(iter.end + 0x91) != '\0') {
      len_1 = len_1 + -1;
    }
    for (i_1 = 0; i_1 < len_1; i_1 = i_1 + 1) {
      if ((iter.end[0x86] == iter.end[0x85]) &&
         (iVar5 = poolGrow((STRING_POOL *)(iter.end + 0x83)), iVar5 == 0)) {
        return (XML_Char *)0x0;
      }
      XVar1 = iter.end[0x73][4].name[i_1];
      pNVar6 = iter.end[0x86];
      iter.end[0x86] = (NAMED *)((long)&pNVar6->name + 1);
      *(XML_Char *)&pNVar6->name = XVar1;
    }
    bVar4 = true;
  }
  hashTableIterInit((HASH_TABLE_ITER *)&i,(HASH_TABLE *)(iter.end + 0x61));
  while( true ) {
    do {
      pNVar6 = hashTableIterNext((HASH_TABLE_ITER *)&i);
      if (pNVar6 == (NAMED *)0x0) {
        hashTableIterInit((HASH_TABLE_ITER *)&i,(HASH_TABLE *)(iter.end + 0x52));
        do {
          do {
            pNVar6 = hashTableIterNext((HASH_TABLE_ITER *)&i);
            if (pNVar6 == (NAMED *)0x0) {
              if ((iter.end[0x86] == iter.end[0x85]) &&
                 (iVar5 = poolGrow((STRING_POOL *)(iter.end + 0x83)), iVar5 == 0)) {
                parser_local = (XML_Parser)0x0;
              }
              else {
                pNVar6 = iter.end[0x86];
                iter.end[0x86] = (NAMED *)((long)&pNVar6->name + 1);
                *(undefined1 *)&pNVar6->name = 0;
                parser_local = iter.end[0x87];
              }
              return (XML_Char *)parser_local;
            }
          } while (*(char *)&pNVar6[7].name == '\0');
          if (bVar4) {
            if ((iter.end[0x86] == iter.end[0x85]) &&
               (iVar5 = poolGrow((STRING_POOL *)(iter.end + 0x83)), iVar5 == 0)) {
              return (XML_Char *)0x0;
            }
            pNVar3 = iter.end[0x86];
            iter.end[0x86] = (NAMED *)((long)&pNVar3->name + 1);
            *(undefined1 *)&pNVar3->name = 0xc;
          }
          for (e = (ENTITY *)pNVar6->name; *(char *)&e->name != '\0';
              e = (ENTITY *)((long)&e->name + 1)) {
            if ((iter.end[0x86] == iter.end[0x85]) &&
               (iVar5 = poolGrow((STRING_POOL *)(iter.end + 0x83)), iVar5 == 0)) {
              return (XML_Char *)0x0;
            }
            uVar2 = *(undefined1 *)&e->name;
            pNVar6 = iter.end[0x86];
            iter.end[0x86] = (NAMED *)((long)&pNVar6->name + 1);
            *(undefined1 *)&pNVar6->name = uVar2;
          }
          bVar4 = true;
        } while( true );
      }
    } while (pNVar6[1].name == (KEY)0x0);
    if (bVar4) {
      if ((iter.end[0x86] == iter.end[0x85]) &&
         (iVar5 = poolGrow((STRING_POOL *)(iter.end + 0x83)), iVar5 == 0)) {
        return (XML_Char *)0x0;
      }
      pNVar3 = iter.end[0x86];
      iter.end[0x86] = (NAMED *)((long)&pNVar3->name + 1);
      *(undefined1 *)&pNVar3->name = 0xc;
    }
    for (prefix = (PREFIX *)pNVar6->name; *(char *)&prefix->name != '\0';
        prefix = (PREFIX *)((long)&prefix->name + 1)) {
      if ((iter.end[0x86] == iter.end[0x85]) &&
         (iVar5 = poolGrow((STRING_POOL *)(iter.end + 0x83)), iVar5 == 0)) {
        return (XML_Char *)0x0;
      }
      uVar2 = *(undefined1 *)&prefix->name;
      pNVar3 = iter.end[0x86];
      iter.end[0x86] = (NAMED *)((long)&pNVar3->name + 1);
      *(undefined1 *)&pNVar3->name = uVar2;
    }
    if ((iter.end[0x86] == iter.end[0x85]) &&
       (iVar5 = poolGrow((STRING_POOL *)(iter.end + 0x83)), iVar5 == 0)) break;
    pNVar3 = iter.end[0x86];
    iter.end[0x86] = (NAMED *)((long)&pNVar3->name + 1);
    *(undefined1 *)&pNVar3->name = 0x3d;
    s._4_4_ = *(int *)(pNVar6[1].name + 0x28);
    if (*(char *)(iter.end + 0x91) != '\0') {
      s._4_4_ = s._4_4_ + -1;
    }
    for (local_38 = 0; local_38 < s._4_4_; local_38 = local_38 + 1) {
      if ((iter.end[0x86] == iter.end[0x85]) &&
         (iVar5 = poolGrow((STRING_POOL *)(iter.end + 0x83)), iVar5 == 0)) {
        return (XML_Char *)0x0;
      }
      uVar2 = *(undefined1 *)(*(long *)(pNVar6[1].name + 0x20) + (long)local_38);
      pNVar3 = iter.end[0x86];
      iter.end[0x86] = (NAMED *)((long)&pNVar3->name + 1);
      *(undefined1 *)&pNVar3->name = uVar2;
    }
    bVar4 = true;
  }
  return (XML_Char *)0x0;
}

Assistant:

static
const XML_Char *getContext(XML_Parser parser)
{
  HASH_TABLE_ITER iter;
  int needSep = 0;

  if (dtd.defaultPrefix.binding) {
    int i;
    int len;
    if (!poolAppendChar(&tempPool, XML_T('=')))
      return 0;
    len = dtd.defaultPrefix.binding->uriLen;
    if (namespaceSeparator != XML_T('\0'))
      len--;
    for (i = 0; i < len; i++)
      if (!poolAppendChar(&tempPool, dtd.defaultPrefix.binding->uri[i]))
        return 0;
    needSep = 1;
  }

  hashTableIterInit(&iter, &(dtd.prefixes));
  for (;;) {
    int i;
    int len;
    const XML_Char *s;
    PREFIX *prefix = (PREFIX *)hashTableIterNext(&iter);
    if (!prefix)
      break;
    if (!prefix->binding)
      continue;
    if (needSep && !poolAppendChar(&tempPool, CONTEXT_SEP))
      return 0;
    for (s = prefix->name; *s; s++)
      if (!poolAppendChar(&tempPool, *s))
        return 0;
    if (!poolAppendChar(&tempPool, XML_T('=')))
      return 0;
    len = prefix->binding->uriLen;
    if (namespaceSeparator != XML_T('\0'))
      len--;
    for (i = 0; i < len; i++)
      if (!poolAppendChar(&tempPool, prefix->binding->uri[i]))
        return 0;
    needSep = 1;
  }


  hashTableIterInit(&iter, &(dtd.generalEntities));
  for (;;) {
    const XML_Char *s;
    ENTITY *e = (ENTITY *)hashTableIterNext(&iter);
    if (!e)
      break;
    if (!e->open)
      continue;
    if (needSep && !poolAppendChar(&tempPool, CONTEXT_SEP))
      return 0;
    for (s = e->name; *s; s++)
      if (!poolAppendChar(&tempPool, *s))
        return 0;
    needSep = 1;
  }

  if (!poolAppendChar(&tempPool, XML_T('\0')))
    return 0;
  return tempPool.start;
}